

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-bs.cpp
# Opt level: O0

int vertexTest(float x,float y)

{
  vec2 local_6c;
  float_t local_64;
  float nrm;
  vec2 p2;
  vec4 p4;
  int i;
  int idx;
  vec2 local_38;
  vec2 local_30;
  vec2 local_28;
  vec2 local_20;
  vec2 ndc;
  vec2 res;
  float y_local;
  float x_local;
  
  dja::vec2::vec2(&ndc,1680.0,1050.0);
  dja::vec2::vec2(&local_38,x,1050.0 - y);
  local_30 = dja::operator*(2.0,&local_38);
  local_28 = dja::operator/(&local_30,&ndc);
  dja::vec2::vec2((vec2 *)&i,1.0);
  local_20 = dja::operator-(&local_28,(vec2 *)&i);
  p4.w = -NAN;
  for (p4.z = 0.0; (int)p4.z < 4 && p4.w == -NAN; p4.z = (float_t)((int)p4.z + 1)) {
    p2 = *(vec2 *)(g_patch.vertices + (int)p4.z);
    dja::vec2::vec2((vec2 *)&stack0xffffffffffffffa0,p2.x,p2.y);
    local_6c = dja::operator-((vec2 *)&stack0xffffffffffffffa0,&local_20);
    local_64 = dja::norm(&local_6c);
    if (local_64 < 32.0 / ndc.x) {
      p4.w = p4.z;
    }
  }
  return (int)p4.w;
}

Assistant:

int vertexTest(float x, float y)
{
    dja::vec2 res = dja::vec2(VIEWER_DEFAULT_WIDTH, VIEWER_DEFAULT_HEIGHT);
    dja::vec2 ndc = 2.0f * dja::vec2(x, VIEWER_DEFAULT_HEIGHT - y) / res - dja::vec2(1.0f);
    int idx = -1;

    for (int i = 0; i < BUFFER_SIZE(g_patch.vertices) && idx == -1; ++i) {
        dja::vec4 p4 = g_patch.vertices[i];
        dja::vec2 p2 = dja::vec2(p4.x, p4.y);
        float nrm = dja::norm(p2 - ndc);

        if (nrm < 32.f / res.x)
            idx = i;
    }

    return idx;
}